

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearize.c
# Opt level: O1

pseudo_t linearize_store_gen(dmr_C *C,entrypoint *ep,pseudo_t value,access_data *ad)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  symbol *psVar4;
  basic_block *pbVar5;
  int iVar6;
  pseudo_t ppVar7;
  pseudo_t ppVar8;
  instruction *ptr;
  symbol *psVar9;
  undefined8 *puVar10;
  int iVar11;
  ulong val;
  access_data *ad_00;
  pseudo_t local_38;
  
  iVar11 = 0;
  if (ad->source_type != (symbol *)0x0) {
    iVar6 = (ad->source_type->field_14).field_1.normal;
    iVar11 = 0;
    if (0 < iVar6) {
      iVar11 = iVar6;
    }
  }
  psVar9 = ad->result_type;
  iVar6 = 0;
  if (psVar9 != (symbol *)0x0) {
    iVar3 = (psVar9->field_14).field_1.normal;
    iVar6 = 0;
    if (0 < iVar3) {
      iVar6 = iVar3;
    }
  }
  ppVar7 = value;
  if (iVar11 != iVar6) {
    bVar1 = *(byte *)((long)&psVar9->field_14 + 0xc);
    bVar2 = *(byte *)((long)&psVar9->field_14 + 8);
    ppVar7 = add_load(C,ep,ad);
    val = -1L << (bVar2 & 0x3f);
    local_38 = value;
    if ((ulong)bVar1 != 0) {
      psVar4 = ad->source_type;
      ppVar8 = dmrC_value_pseudo(C,psVar9,(ulong)bVar1);
      local_38 = add_binary_op(C,ep,psVar4,0x11,value,ppVar8);
      val = ~(~val << (bVar1 & 0x3f));
    }
    psVar4 = ad->source_type;
    ppVar8 = dmrC_value_pseudo(C,psVar9,val);
    ppVar7 = add_binary_op(C,ep,psVar4,0x14,ppVar7,ppVar8);
    ppVar7 = add_binary_op(C,ep,ad->source_type,0x15,ppVar7,local_38);
  }
  if (ep->active != (basic_block *)0x0) {
    ad_00 = (access_data *)0x2a;
    ptr = alloc_typed_instruction(C,0x2a,ad->source_type);
    (ptr->field_6).field_5.offset = ad->offset;
    psVar9 = get_base_symbol_type((dmr_C *)ad,ad_00);
    (ptr->field_6).field_5.orig_type = psVar9;
    (ptr->field_5).target = ppVar7;
    if (((ppVar7 != (pseudo_t)0x0) && (ppVar7->type != PSEUDO_VOID)) && (ppVar7->type != PSEUDO_VAL)
       ) {
      puVar10 = (undefined8 *)dmrC_allocator_allocate(&C->L->pseudo_user_allocator,0);
      puVar10[1] = &ptr->field_5;
      *puVar10 = ptr;
      ptrlist_add((ptr_list **)&ppVar7->users,puVar10,&C->ptrlist_allocator);
    }
    ppVar7 = ad->address;
    (ptr->field_6).field_4.phi_src = ppVar7;
    if (((ppVar7 != (pseudo_t)0x0) && (ppVar7->type != PSEUDO_VOID)) && (ppVar7->type != PSEUDO_VAL)
       ) {
      puVar10 = (undefined8 *)dmrC_allocator_allocate(&C->L->pseudo_user_allocator,0);
      puVar10[1] = &ptr->field_6;
      *puVar10 = ptr;
      ptrlist_add((ptr_list **)&ppVar7->users,puVar10,&C->ptrlist_allocator);
    }
    pbVar5 = ep->active;
    if (pbVar5 != (basic_block *)0x0) {
      ptr->bb = pbVar5;
      ptrlist_add((ptr_list **)&pbVar5->insns,ptr,&C->ptrlist_allocator);
    }
  }
  return value;
}

Assistant:

static pseudo_t linearize_store_gen(struct dmr_C *C, struct entrypoint *ep,
		pseudo_t value,
		struct access_data *ad)
{
	pseudo_t store = value;

	if (type_size(ad->source_type) != type_size(ad->result_type)) {
		struct symbol *ctype = ad->result_type;
		unsigned int shift = ctype->bit_offset;
		unsigned int size = ctype->bit_size;
		pseudo_t orig = add_load(C, ep, ad);
		unsigned long long mask = (1ULL << size) - 1;

		if (shift) {
			store = add_binary_op(C, ep, ad->source_type, OP_SHL, value, dmrC_value_pseudo(C, ctype, shift));
			mask <<= shift;
		}
		orig = add_binary_op(C, ep, ad->source_type, OP_AND, orig, dmrC_value_pseudo(C, ctype, ~mask));
		store = add_binary_op(C, ep, ad->source_type, OP_OR, orig, store);
	}
	add_store(C, ep, ad, store);
	return value;
}